

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAiger.c
# Opt level: O0

Vec_Int_t * Gia_AigerCollectLiterals(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  bool bVar2;
  undefined4 local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLits;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManPoNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar2 = false;
    if (local_24 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pGStack_20 = Gia_ManCo(p,iVar1 + local_24);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjFaninLit0p(p,pGStack_20);
    Vec_IntPush(p_00,iVar1);
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar2 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(p,local_24);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjFaninLit0p(p,pGStack_20);
    Vec_IntPush(p_00,iVar1);
    local_24 = local_24 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_AigerCollectLiterals( Gia_Man_t * p )
{
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj;
    int i;
    vLits = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachRi( p, pObj, i )
        Vec_IntPush( vLits, Gia_ObjFaninLit0p(p, pObj) );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vLits, Gia_ObjFaninLit0p(p, pObj) );
    return vLits;
}